

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O1

uint8_t * push_insns(VARR_uint8_t *insn_varr,uint8_t *pat,size_t pat_len)

{
  uint8_t uVar1;
  size_t sVar2;
  ulong uVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  int iVar6;
  uint8_t *in_RCX;
  uint extraout_EDX;
  undefined4 uVar7;
  uint8_t *puVar8;
  VARR_uint8_t *insn_varr_00;
  uint8_t *__size;
  size_t sVar9;
  
  puVar8 = pat;
  insn_varr_00 = insn_varr;
  if (pat_len != 0) {
    sVar9 = 0;
    do {
      uVar7 = SUB84(puVar8,0);
      iVar6 = (int)in_RCX;
      insn_varr_00 = (VARR_uint8_t *)insn_varr->varr;
      if (insn_varr_00 == (VARR_uint8_t *)0x0) {
        push_insns_cold_1();
        goto LAB_0013f660;
      }
      uVar1 = pat[sVar9];
      uVar3 = insn_varr->els_num + 1;
      if (insn_varr->size < uVar3) {
        __size = (uint8_t *)((uVar3 >> 1) + uVar3);
        puVar8 = __size;
        puVar4 = (uint8_t *)realloc(insn_varr_00,(size_t)__size);
        insn_varr->varr = puVar4;
        insn_varr->size = (size_t)__size;
      }
      sVar2 = insn_varr->els_num;
      in_RCX = insn_varr->varr;
      insn_varr->els_num = sVar2 + 1;
      in_RCX[sVar2] = uVar1;
      sVar9 = sVar9 + 1;
    } while (pat_len != sVar9);
  }
  uVar7 = SUB84(puVar8,0);
  iVar6 = (int)in_RCX;
  if (insn_varr != (VARR_uint8_t *)0x0) {
    return insn_varr->varr + (insn_varr->els_num - pat_len);
  }
LAB_0013f660:
  push_insns_cold_2();
  puVar8 = gen_mov::ld_gp_reg;
  if (iVar6 == 0) {
    puVar8 = gen_mov::st_gp_reg;
  }
  pbVar5 = push_insns(insn_varr_00,puVar8,7);
  *(undefined4 *)(pbVar5 + 3) = uVar7;
  if (extraout_EDX < 0x10) {
    *pbVar5 = *pbVar5 | (byte)extraout_EDX >> 1 & 4;
    pbVar5[2] = pbVar5[2] | ((byte)extraout_EDX & 7) << 3;
    return pbVar5;
  }
  __assert_fail("reg <= 15",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-x86_64.c"
                ,0x103,"void gen_mov(VARR_uint8_t *, uint32_t, uint32_t, int)");
}

Assistant:

static uint8_t *push_insns (VARR (uint8_t) * insn_varr, const uint8_t *pat, size_t pat_len) {
  for (size_t i = 0; i < pat_len; i++) VARR_PUSH (uint8_t, insn_varr, pat[i]);
  return VARR_ADDR (uint8_t, insn_varr) + VARR_LENGTH (uint8_t, insn_varr) - pat_len;
}